

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O1

void Aig_ObjComputeCuts(Aig_ManCut_t *p,Aig_Obj_t *pObj,int fTriv)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Aig_Cut_t *pCut;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  void *pvVar10;
  Aig_Cut_t *pCut1;
  Aig_Cut_t *pAVar11;
  Aig_Cut_t *pCut0;
  
  if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigCuts.c"
                  ,0x247,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
  }
  if (p->pCuts[pObj->Id] != (Aig_Cut_t *)0x0) {
    __assert_fail("Aig_ObjCuts(p, pObj) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigCuts.c"
                  ,0x248,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
  }
  pAVar1 = pObj->pFanin0;
  pAVar2 = pObj->pFanin1;
  Aig_ObjPrepareCuts(p,pObj,fTriv);
  if (0 < p->nCutsMax) {
    pCut0 = p->pCuts[*(int *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x24)];
    iVar6 = 0;
    do {
      if (('\0' < pCut0->nFanins) && (iVar4 = p->nCutsMax, 0 < iVar4)) {
        pCut1 = p->pCuts[*(int *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x24)];
        iVar8 = 0;
        do {
          if (('\0' < pCut1->nFanins) &&
             (uVar5 = pCut1->uSign | pCut0->uSign,
             uVar5 = (uVar5 >> 1 & 0x55555555) + (uVar5 & 0x55555555),
             uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333),
             uVar5 = (uVar5 >> 4 & 0x7070707) + (uVar5 & 0x7070707),
             uVar5 = (uVar5 >> 8 & 0xf000f) + (uVar5 & 0xf000f),
             (int)((uVar5 >> 0x10) + (uVar5 & 0xffff)) <= p->nLeafMax)) {
            if (iVar4 < 1) {
              pAVar11 = (Aig_Cut_t *)0x0;
            }
            else {
              pCut = p->pCuts[pObj->Id];
              pAVar11 = (Aig_Cut_t *)0x0;
              do {
                if (pCut->nFanins == '\0') goto LAB_006b4338;
                if ((pAVar11 == (Aig_Cut_t *)0x0) || (pAVar11->Cost < pCut->Cost)) {
                  pAVar11 = pCut;
                }
                pCut = (Aig_Cut_t *)((long)&pCut->pNext + (long)pCut->nCutSize);
                iVar4 = iVar4 + -1;
              } while (iVar4 != 0);
            }
            if (pAVar11 == (Aig_Cut_t *)0x0) {
              __assert_fail("pCutMax != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigCuts.c"
                            ,0xe8,"Aig_Cut_t *Aig_CutFindFree(Aig_ManCut_t *, Aig_Obj_t *)");
            }
            pAVar11->nFanins = '\0';
            pCut = pAVar11;
LAB_006b4338:
            iVar4 = Aig_CutMerge(p,pCut0,pCut1,pCut);
            if (iVar4 == 0) {
              if (pCut->nFanins != '\0') {
                __assert_fail("pCut->nFanins == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigCuts.c"
                              ,0x259,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
              }
            }
            else {
              iVar4 = Aig_CutFilter(p,pObj,pCut);
              if (iVar4 == 0) {
                if (p->fTruth != 0) {
                  Aig_CutComputeTruth(p,pCut,pCut0,pCut1,*(uint *)&pObj->pFanin0 & 1,
                                      *(uint *)&pObj->pFanin1 & 1);
                }
                uVar7 = (ulong)pCut->nFanins;
                if ((long)uVar7 < 1) {
                  __assert_fail("pCut->nFanins > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigCuts.c"
                                ,0xb5,"int Aig_CutFindCost(Aig_ManCut_t *, Aig_Cut_t *)");
                }
                pVVar3 = p->pAig->vObjs;
                uVar9 = 0;
                iVar4 = 0;
                do {
                  if (pVVar3 == (Vec_Ptr_t *)0x0) {
                    pvVar10 = (void *)0x0;
                  }
                  else {
                    uVar5 = *(uint *)((long)&pCut[1].pNext + uVar9 * 4);
                    if (((int)uVar5 < 0) || (pVVar3->nSize <= (int)uVar5)) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                    }
                    pvVar10 = pVVar3->pArray[uVar5];
                  }
                  if (pvVar10 == (void *)0x0) break;
                  iVar4 = iVar4 + (*(uint *)((long)pvVar10 + 0x18) >> 6);
                  uVar9 = uVar9 + 1;
                } while (uVar7 != uVar9);
                iVar4 = (int)((ulong)(uint)(iVar4 * 1000) / (uVar7 & 0xffffffff));
                pCut->Cost = iVar4;
                if (iVar4 < 1) {
                  __assert_fail("pCut->Cost > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigCuts.c"
                                ,0x268,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
                }
              }
              else if (pCut->nFanins != '\0') {
                __assert_fail("pCut->nFanins == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigCuts.c"
                              ,0x25f,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
              }
            }
          }
          iVar8 = iVar8 + 1;
          pCut1 = (Aig_Cut_t *)((long)&pCut1->pNext + (long)pCut1->nCutSize);
          iVar4 = p->nCutsMax;
        } while (iVar8 < iVar4);
      }
      iVar6 = iVar6 + 1;
      pCut0 = (Aig_Cut_t *)((long)&pCut0->pNext + (long)pCut0->nCutSize);
    } while (iVar6 < p->nCutsMax);
  }
  return;
}

Assistant:

void Aig_ObjComputeCuts( Aig_ManCut_t * p, Aig_Obj_t * pObj, int fTriv )
{
    Aig_Cut_t * pCut0, * pCut1, * pCut, * pCutSet;
    Aig_Obj_t * pFanin0 = Aig_ObjFanin0(pObj);
    Aig_Obj_t * pFanin1 = Aig_ObjFanin1(pObj);
    int i, k;
    // the node is not processed yet
    assert( Aig_ObjIsNode(pObj) );
    assert( Aig_ObjCuts(p, pObj) == NULL );
    // set up the first cut
    pCutSet = Aig_ObjPrepareCuts( p, pObj, fTriv );
    // compute pair-wise cut combinations while checking table
    Aig_ObjForEachCut( p, pFanin0, pCut0, i )
    if ( pCut0->nFanins > 0 )
    Aig_ObjForEachCut( p, pFanin1, pCut1, k )
    if ( pCut1->nFanins > 0 )
    {
        // make sure K-feasible cut exists
        if ( Kit_WordCountOnes(pCut0->uSign | pCut1->uSign) > p->nLeafMax )
            continue;
        // get the next cut of this node
        pCut = Aig_CutFindFree( p, pObj );
        // assemble the new cut
        if ( !Aig_CutMerge( p, pCut0, pCut1, pCut ) )
        {
            assert( pCut->nFanins == 0 );
            continue;
        }
        // check containment
        if ( Aig_CutFilter( p, pObj, pCut ) )
        {
            assert( pCut->nFanins == 0 );
            continue;
        }
        // create its truth table
        if ( p->fTruth )
            Aig_CutComputeTruth( p, pCut, pCut0, pCut1, Aig_ObjFaninC0(pObj), Aig_ObjFaninC1(pObj) );
        // assign the cost
        pCut->Cost = Aig_CutFindCost( p, pCut );
        assert( pCut->nFanins > 0 );
        assert( pCut->Cost > 0 );
    }
}